

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingDescriptorPoller.cpp
# Opt level: O0

ControlledPollAction __thiscall
aeron::archive::RecordingDescriptorPoller::onFragment
          (RecordingDescriptorPoller *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  long lVar1;
  long __args_1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  index_t iVar5;
  int32_t __args_7;
  int32_t __args_8;
  int32_t __args_9;
  int32_t __args_10;
  int32_t __args_11;
  int32_t __args_12;
  int iVar6;
  uint8_t *puVar7;
  uint64_t uVar8;
  int64_t iVar9;
  ArchiveException *pAVar10;
  char *pcVar11;
  int64_t __args_3;
  int64_t __args_4;
  int64_t __args_5;
  int64_t __args_6;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  RecordingDescriptor msg_1;
  string local_1c0;
  allocator local_199;
  string local_198;
  string local_178;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int64_t local_c8;
  int64_t correlationId;
  undefined1 local_b8 [4];
  Value code;
  ControlResponse msg;
  undefined1 local_78 [6];
  uint16_t templateId;
  MessageHeader hdr;
  Header *header_local;
  index_t length_local;
  index_t offset_local;
  AtomicBuffer *buffer_local;
  RecordingDescriptorPoller *this_local;
  
  hdr.m_actingVersion = (uint64_t)header;
  io::aeron::archive::codecs::MessageHeader::MessageHeader((MessageHeader *)local_78);
  puVar7 = concurrent::AtomicBuffer::buffer(buffer);
  iVar5 = concurrent::AtomicBuffer::capacity(buffer);
  io::aeron::archive::codecs::MessageHeader::wrap
            ((MessageHeader *)local_78,(char *)puVar7,(long)offset,0,(long)iVar5);
  uVar2 = io::aeron::archive::codecs::MessageHeader::templateId((MessageHeader *)local_78);
  msg.m_actingVersion._6_2_ = uVar2;
  uVar3 = io::aeron::archive::codecs::ControlResponse::sbeTemplateId();
  uVar4 = msg.m_actingVersion._6_2_;
  if (uVar2 == uVar3) {
    io::aeron::archive::codecs::ControlResponse::ControlResponse((ControlResponse *)local_b8);
    puVar7 = concurrent::AtomicBuffer::buffer(buffer);
    uVar8 = io::aeron::archive::codecs::MessageHeader::encodedLength();
    uVar4 = io::aeron::archive::codecs::MessageHeader::blockLength((MessageHeader *)local_78);
    uVar2 = io::aeron::archive::codecs::MessageHeader::version((MessageHeader *)local_78);
    iVar5 = concurrent::AtomicBuffer::capacity(buffer);
    io::aeron::archive::codecs::ControlResponse::wrapForDecode
              ((ControlResponse *)local_b8,(char *)puVar7,(long)offset + uVar8,(ulong)uVar4,
               (ulong)uVar2,(long)iVar5);
    lVar1 = this->controlSessionId_;
    iVar9 = io::aeron::archive::codecs::ControlResponse::controlSessionId
                      ((ControlResponse *)local_b8);
    if (lVar1 == iVar9) {
      correlationId._4_4_ =
           io::aeron::archive::codecs::ControlResponse::code((ControlResponse *)local_b8);
      local_c8 = io::aeron::archive::codecs::ControlResponse::correlationId
                           ((ControlResponse *)local_b8);
      if ((correlationId._4_4_ == RECORDING_UNKNOWN) && (this->correlationId_ == local_c8)) {
        this->isDispatchComplete_ = true;
        return BREAK;
      }
      if (correlationId._4_4_ == ERROR) {
        msg_1.m_actingVersion._6_1_ = 1;
        pAVar10 = (ArchiveException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_148,this->correlationId_);
        std::operator+(&local_128,"response for correlationId=",&local_148);
        std::operator+(&local_108,&local_128,", error: ");
        io::aeron::archive::codecs::ControlResponse::getErrorMessageAsString_abi_cxx11_
                  (&local_178,(ControlResponse *)local_b8);
        std::operator+(&local_e8,&local_108,&local_178);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_198,
                   "ControlledPollAction aeron::archive::RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                   ,&local_199);
        pcVar11 = aeron::util::past_prefix
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp"
                            );
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1c0,pcVar11,(allocator *)((long)&msg_1.m_actingVersion + 7));
        ArchiveException::ArchiveException(pAVar10,&local_e8,&local_198,&local_1c0,0x4e);
        msg_1.m_actingVersion._6_1_ = 0;
        __cxa_throw(pAVar10,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
      }
    }
  }
  else {
    uVar2 = io::aeron::archive::codecs::RecordingDescriptor::sbeTemplateId();
    if (uVar4 != uVar2) {
      pAVar10 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_2a0,(uint)msg.m_actingVersion._6_2_);
      std::operator+(&local_280,"unknown template id: ",&local_2a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2c0,
                 "ControlledPollAction aeron::archive::RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                 ,&local_2c1);
      pcVar11 = aeron::util::past_prefix
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp"
                          );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e8,pcVar11,&local_2e9);
      ArchiveException::ArchiveException(pAVar10,&local_280,&local_2c0,&local_2e8,0x62);
      __cxa_throw(pAVar10,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
    io::aeron::archive::codecs::RecordingDescriptor::RecordingDescriptor
              ((RecordingDescriptor *)local_200);
    puVar7 = concurrent::AtomicBuffer::buffer(buffer);
    uVar8 = io::aeron::archive::codecs::MessageHeader::encodedLength();
    uVar4 = io::aeron::archive::codecs::MessageHeader::blockLength((MessageHeader *)local_78);
    uVar2 = io::aeron::archive::codecs::MessageHeader::version((MessageHeader *)local_78);
    iVar5 = concurrent::AtomicBuffer::capacity(buffer);
    io::aeron::archive::codecs::RecordingDescriptor::wrapForDecode
              ((RecordingDescriptor *)local_200,(char *)puVar7,(long)offset + uVar8,(ulong)uVar4,
               (ulong)uVar2,(long)iVar5);
    lVar1 = this->controlSessionId_;
    iVar9 = io::aeron::archive::codecs::RecordingDescriptor::controlSessionId
                      ((RecordingDescriptor *)local_200);
    if ((lVar1 == iVar9) &&
       (lVar1 = this->correlationId_,
       iVar9 = io::aeron::archive::codecs::RecordingDescriptor::correlationId
                         ((RecordingDescriptor *)local_200), lVar1 == iVar9)) {
      lVar1 = this->controlSessionId_;
      __args_1 = this->correlationId_;
      iVar9 = io::aeron::archive::codecs::RecordingDescriptor::recordingId
                        ((RecordingDescriptor *)local_200);
      __args_3 = io::aeron::archive::codecs::RecordingDescriptor::startTimestamp
                           ((RecordingDescriptor *)local_200);
      __args_4 = io::aeron::archive::codecs::RecordingDescriptor::stopTimestamp
                           ((RecordingDescriptor *)local_200);
      __args_5 = io::aeron::archive::codecs::RecordingDescriptor::startPosition
                           ((RecordingDescriptor *)local_200);
      __args_6 = io::aeron::archive::codecs::RecordingDescriptor::stopPosition
                           ((RecordingDescriptor *)local_200);
      __args_7 = io::aeron::archive::codecs::RecordingDescriptor::initialTermId
                           ((RecordingDescriptor *)local_200);
      __args_8 = io::aeron::archive::codecs::RecordingDescriptor::segmentFileLength
                           ((RecordingDescriptor *)local_200);
      __args_9 = io::aeron::archive::codecs::RecordingDescriptor::termBufferLength
                           ((RecordingDescriptor *)local_200);
      __args_10 = io::aeron::archive::codecs::RecordingDescriptor::mtuLength
                            ((RecordingDescriptor *)local_200);
      __args_11 = io::aeron::archive::codecs::RecordingDescriptor::sessionId
                            ((RecordingDescriptor *)local_200);
      __args_12 = io::aeron::archive::codecs::RecordingDescriptor::streamId
                            ((RecordingDescriptor *)local_200);
      io::aeron::archive::codecs::RecordingDescriptor::getStrippedChannelAsString_abi_cxx11_
                (&local_220,(RecordingDescriptor *)local_200);
      io::aeron::archive::codecs::RecordingDescriptor::getOriginalChannelAsString_abi_cxx11_
                (&local_240,(RecordingDescriptor *)local_200);
      io::aeron::archive::codecs::RecordingDescriptor::getSourceIdentityAsString_abi_cxx11_
                (&local_260,(RecordingDescriptor *)local_200);
      std::
      function<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->consumer_,lVar1,__args_1,iVar9,__args_3,__args_4,__args_5,__args_6,
                   __args_7,__args_8,__args_9,__args_10,__args_11,__args_12,&local_220,&local_240,
                   &local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_220);
      iVar6 = this->remainingRecordCount_ + -1;
      this->remainingRecordCount_ = iVar6;
      if (iVar6 == 0) {
        this->isDispatchComplete_ = true;
        return BREAK;
      }
    }
  }
  return CONTINUE;
}

Assistant:

ControlledPollAction RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer& buffer, util::index_t offset,
                                                           util::index_t length, Header& header) {
    codecs::MessageHeader hdr;
    hdr.wrap((char*)buffer.buffer(), offset, 0, buffer.capacity());

    const std::uint16_t templateId = hdr.templateId();

    if (templateId == codecs::ControlResponse::sbeTemplateId()) {
        codecs::ControlResponse msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        if (controlSessionId_ == msg.controlSessionId()) {
            auto code = msg.code();
            const std::int64_t correlationId = msg.correlationId();

            if (code == codecs::ControlResponseCode::RECORDING_UNKNOWN &&
                correlationId_ == correlationId) {
                isDispatchComplete_ = true;
                return ControlledPollAction::BREAK;
            } else if (code == codecs::ControlResponseCode::ERROR) {
                throw ArchiveException(
                    "response for correlationId=" + std::to_string(correlationId_) +
                    ", error: " + msg.getErrorMessageAsString(), SOURCEINFO);
            }
        }
    } else if (templateId == codecs::RecordingDescriptor::sbeTemplateId()) {
        codecs::RecordingDescriptor msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        if (controlSessionId_ == msg.controlSessionId() && correlationId_ == msg.correlationId()) {
            consumer_(controlSessionId_, correlationId_, msg.recordingId(), msg.startTimestamp(), msg.stopTimestamp(),
                      msg.startPosition(), msg.stopPosition(), msg.initialTermId(), msg.segmentFileLength(),
                      msg.termBufferLength(), msg.mtuLength(), msg.sessionId(), msg.streamId(), msg.getStrippedChannelAsString(),
                      msg.getOriginalChannelAsString(), msg.getSourceIdentityAsString());

            if (--remainingRecordCount_ == 0) {
                isDispatchComplete_ = true;
                return ControlledPollAction::BREAK;
            }
        }
    } else {
        throw ArchiveException("unknown template id: " + std::to_string(templateId), SOURCEINFO);
    }

    return ControlledPollAction::CONTINUE;
}